

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int grapg_5_3::kruskal(m_graph g)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int i;
  long lVar6;
  ulong uVar7;
  ulong uStack_10;
  
  lVar3 = -((ulong)(uint)g.vexs[8] * 4 + 0xf & 0xfffffffffffffff0);
  lVar4 = lVar3 + -8;
  *(undefined8 *)((long)&uStack_10 + lVar3) = 1;
  for (lVar6 = *(long *)((long)&uStack_10 + lVar3); lVar6 < g.vexs[8]; lVar6 = lVar6 + 1) {
    *(undefined4 *)(&stack0xfffffffffffffff8 + lVar6 * 4 + lVar4 + 8) =
         *(undefined4 *)((long)(g.arc + -1) + 0x20 + lVar6 * 4);
  }
  *(undefined8 *)((long)&uStack_10 + lVar3) = 1;
  uVar2 = *(ulong *)((long)&uStack_10 + lVar3);
  uVar5 = uVar2;
  do {
    do {
      uVar7 = uVar5;
      uVar5 = uVar2;
    } while ((uint)g.vexs[8] == uVar7);
    if ((*(int *)(&stack0xfffffffffffffff8 + uVar7 * 4 + lVar4 + 8) != 0) &&
       (iVar1 = *(int *)((long)(g.arc + -1) + 0x20 + uVar7 * 4),
       iVar1 < *(int *)(&stack0xfffffffffffffff8 + uVar7 * 4 + lVar4 + 8))) {
      *(int *)(&stack0xfffffffffffffff8 + uVar7 * 4 + lVar4 + 8) = iVar1;
    }
    uVar5 = uVar7 + 1;
  } while( true );
}

Assistant:

int prim_3(m_graph g) {
        int adj[g.vnum], dis[g.vnum], min, j, k;
        adj[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adj[i] = 0;
        }

        for (int i = 0; i < g.vnum; i++) {
            j = 1;
            k = 0;
            min = INTMAX_MAX;
            while (j < g.vnum) {
                if (dis[j] == 0 && dis[j] < min) {
                    k = j;
                    min = dis[j];
                }
                j++;
            }
            //do sth for adj[k]
            dis[k] = 0;
            for (int j = 1; j < g.vnum; j++) {
                if (dis[j] != 0 && g.arc[k][j] < dis[j]) {
                    dis[j] = g.arc[k][j];
                    adj[j] = k;
                }
            }
        }
    }